

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<unsigned_char>&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<unsigned_char> *params)

{
  ArrayPtr<unsigned_char> *this_00;
  ArrayPtr<unsigned_char> *value;
  Delimited<kj::ArrayPtr<unsigned_char>_> *params_00;
  Delimited<kj::ArrayPtr<unsigned_char>_> local_50;
  kj *local_18;
  ArrayPtr<unsigned_char> *params_local;
  
  local_18 = this;
  params_local = (ArrayPtr<unsigned_char> *)__return_storage_ptr__;
  this_00 = fwd<kj::ArrayPtr<unsigned_char>&>((ArrayPtr<unsigned_char> *)this);
  toCharSequence<kj::ArrayPtr<unsigned_char>&>(&local_50,(kj *)this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<unsigned_char>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}